

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmisc.c
# Opt level: O1

uint pseudo_gen_alloc(PseudoGenerator *generator,_Bool top)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined7 in_register_00000031;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  
  if ((int)CONCAT71(in_register_00000031,top) == 0) {
    uVar4 = 0;
    uVar7 = 0;
    do {
      uVar1 = generator->bits[uVar7];
      if (uVar1 == 0xffffffffffffffff) {
        uVar4 = (ulong)((int)uVar4 + 0x40);
        bVar9 = true;
      }
      else {
        uVar6 = 0;
        do {
          uVar8 = 1L << ((byte)uVar6 & 0x3f);
          bVar9 = (uVar8 & uVar1) != 0;
          uVar4 = (ulong)((uint)bVar9 + (int)uVar4);
          if ((uVar8 & uVar1) == 0) break;
          bVar10 = uVar6 < 0x3f;
          uVar6 = uVar6 + 1;
        } while (bVar10);
      }
    } while ((bVar9) && (bVar9 = uVar7 < 3, uVar7 = uVar7 + 1, bVar9));
  }
  else {
    uVar5 = 3;
    iVar2 = -0xc0;
    do {
      if (generator->bits[uVar5] != 0) {
        uVar4 = (ulong)(uint)-iVar2;
        uVar7 = generator->bits[uVar5];
        do {
          uVar4 = (ulong)((int)uVar4 + 1);
          bVar9 = 1 < uVar7;
          uVar7 = uVar7 >> 1;
        } while (bVar9);
        goto LAB_001022ed;
      }
      iVar2 = iVar2 + 0x40;
      bVar9 = uVar5 != 0;
      uVar5 = uVar5 - 1;
    } while (bVar9);
    uVar4 = 0;
  }
LAB_001022ed:
  uVar3 = (uint)uVar4;
  generator->bits[uVar4 >> 6] = generator->bits[uVar4 >> 6] | 1L << ((byte)uVar4 & 0x3f);
  uVar5 = generator->max_reg;
  if (uVar5 < uVar3) {
    __assert_fail("reg <= generator->max_reg",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/tests/tmisc.c"
                  ,0x12e,"unsigned int pseudo_gen_alloc(PseudoGenerator *, _Bool)");
  }
  if (uVar3 == uVar5) {
    generator->max_reg = uVar5 + 1;
  }
  return uVar3;
}

Assistant:

static unsigned pseudo_gen_alloc(PseudoGenerator *generator, bool top)
{
	unsigned reg;
	if (top) {
		int current_top = top_reg(generator);
		reg = current_top + 1;
	} else {
		/* look for the first free reg */
		reg = 0;
		int is_set = 1;
		for (int i = 0; is_set && i < N_WORDS; i++) {
			uint64_t bit = generator->bits[i];
			if (bit == ~0ull) {
				/* all bits set? skip */ 
				reg += ESIZE;
				continue;
			} 
			for (int j = 0; is_set && j < ESIZE; j++) {
				is_set = (bit & (1ull << j)) != 0;
				if (is_set)
					reg++;
			}
		}
	}
	unsigned i = reg / ESIZE;
	unsigned j = reg % ESIZE;
	generator->bits[i] |= (1ull << j);
	assert(reg <= generator->max_reg);
	if (reg == generator->max_reg)
		generator->max_reg += 1;
	return reg;
}